

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_list_int(kvtree *hash,int *n,int **v)

{
  int iVar1;
  int *__base;
  kvtree_elem *pkStack_40;
  int key;
  kvtree_elem *elem;
  int *list;
  int count;
  int **v_local;
  int *n_local;
  kvtree *hash_local;
  
  *n = 0;
  *v = (int *)0x0;
  iVar1 = kvtree_size(hash);
  if (iVar1 != 0) {
    __base = (int *)kvtree_malloc((long)iVar1 << 2,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                                  ,0x2a0);
    list._4_4_ = 0;
    for (pkStack_40 = kvtree_elem_first(hash); pkStack_40 != (kvtree_elem *)0x0;
        pkStack_40 = kvtree_elem_next(pkStack_40)) {
      iVar1 = kvtree_elem_key_int(pkStack_40);
      __base[list._4_4_] = iVar1;
      list._4_4_ = list._4_4_ + 1;
    }
    qsort(__base,(long)list._4_4_,4,kvtree_cmp_fn_int_asc);
    *n = list._4_4_;
    *v = __base;
  }
  return 0;
}

Assistant:

int kvtree_list_int(const kvtree* hash, int* n, int** v)
{
  /* assume there aren't any keys */
  *n = 0;
  *v = NULL;

  /* count the number of keys */
  int count = kvtree_size(hash);
  if (count == 0) {
    return KVTREE_SUCCESS;
  }

  /* now allocate array of ints to save keys */
  int* list = (int*) KVTREE_MALLOC(count * sizeof(int));

  /* record key values in array */
  count = 0;
  kvtree_elem* elem;
  for (elem = kvtree_elem_first(hash);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    int key = kvtree_elem_key_int(elem);
    list[count] = key;
    count++;
  }

  /* sort the keys */
  qsort(list, count, sizeof(int), &kvtree_cmp_fn_int_asc);

  *n = count;
  *v = list;

  return KVTREE_SUCCESS;
}